

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_init(nk_font_atlas *atlas,nk_allocator *alloc)

{
  nk_allocator *alloc_local;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3492,"void nk_font_atlas_init(struct nk_font_atlas *, struct nk_allocator *)");
  }
  if (alloc == (nk_allocator *)0x0) {
    __assert_fail("alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3493,"void nk_font_atlas_init(struct nk_font_atlas *, struct nk_allocator *)");
  }
  if ((atlas != (nk_font_atlas *)0x0) && (alloc != (nk_allocator *)0x0)) {
    nk_zero(atlas,400);
    (atlas->permanent).userdata = alloc->userdata;
    (atlas->permanent).alloc = alloc->alloc;
    (atlas->permanent).free = alloc->free;
    (atlas->temporary).userdata = alloc->userdata;
    (atlas->temporary).alloc = alloc->alloc;
    (atlas->temporary).free = alloc->free;
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_init(struct nk_font_atlas *atlas, struct nk_allocator *alloc)
{
    NK_ASSERT(atlas);
    NK_ASSERT(alloc);
    if (!atlas || !alloc) return;
    nk_zero_struct(*atlas);
    atlas->permanent = *alloc;
    atlas->temporary = *alloc;
}